

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

bool Omega_h::is_sorted<double>(Read<double> *a)

{
  undefined1 local_90 [8];
  type transform;
  logical_and<bool> op;
  bool init;
  IntIterator last;
  IntIterator first;
  Read<double> *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) < 2) {
    a_local._3_1_ = true;
  }
  else {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    transform.a.write_.shared_alloc_.direct_ptr._7_1_ = 1;
    transform.a.write_.shared_alloc_.direct_ptr._6_1_ = 0;
    Read<double>::Read((Read<double> *)local_90,a);
    a_local._3_1_ =
         transform_reduce<Omega_h::IntIterator,Omega_h::is_sorted<double>(Omega_h::Read<double>)::_lambda(int)_1_,bool,Omega_h::logical_and<bool>>
                   (0,(int)(local_20 >> 3) + -1,1,(Read<double> *)local_90);
    is_sorted<double>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_90);
  }
  return a_local._3_1_;
}

Assistant:

bool is_sorted(Read<T> a) {
  if (a.size() < 2) return true;
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size() - 1);
  auto const init = true;
  auto const op = logical_and<bool>();
  auto transform = OMEGA_H_LAMBDA(LO i)->bool { return a[i] <= a[i + 1]; };
  return transform_reduce(first, last, init, op, std::move(transform));
}